

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<unsigned_char>_> *
kj::parse::
Many_<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>,_true>
::Impl<capnp::compiler::Lexer::ParserInput,_unsigned_char>::apply
          (Maybe<kj::Array<unsigned_char>_> *__return_storage_ptr__,
          Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
          *subParser,ParserInput *input)

{
  char *pcVar1;
  char cVar2;
  uchar uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Maybe<kj::Array<unsigned_char>_> *pMVar7;
  char *pcVar8;
  size_t sVar9;
  Results results;
  ParserInput subInput;
  undefined1 local_8a [42];
  Maybe<kj::Array<unsigned_char>_> *local_60;
  ParserInput *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_8a._2_8_ = (uchar *)0x0;
  local_8a._10_8_ = (uchar *)0x0;
  local_8a._18_8_ = (uchar *)0x0;
  local_60 = __return_storage_ptr__;
  do {
    pcVar8 = (input->super_IteratorInput<char,_const_char_*>).pos;
    pcVar1 = (input->super_IteratorInput<char,_const_char_*>).end;
    if (pcVar8 == pcVar1) break;
    local_38 = input->begin;
    local_58 = input;
    local_50 = pcVar8;
    local_48 = pcVar1;
    local_40 = pcVar8;
    Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
    ::operator()<capnp::compiler::Lexer::ParserInput>
              ((Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
                *)local_8a,(ParserInput *)subParser);
    uVar3 = local_8a[1];
    cVar2 = local_8a[0];
    if (local_8a[0] == '\x01') {
      (local_58->super_IteratorInput<char,_const_char_*>).pos = local_50;
      if (local_8a._10_8_ == local_8a._18_8_) {
        sVar9 = (local_8a._18_8_ - local_8a._2_8_) * 2;
        if (local_8a._18_8_ == local_8a._2_8_) {
          sVar9 = 4;
        }
        Vector<unsigned_char>::setCapacity((Vector<unsigned_char> *)(local_8a + 2),sVar9);
      }
      *(uchar *)local_8a._10_8_ = uVar3;
      local_8a._10_8_ = local_8a._10_8_ + 1;
    }
    if (local_58 != (ParserInput *)0x0) {
      pcVar8 = local_40;
      if (local_40 < local_50) {
        pcVar8 = local_50;
      }
      pcVar1 = (local_58->super_IteratorInput<char,_const_char_*>).best;
      if (pcVar8 <= pcVar1) {
        pcVar8 = pcVar1;
      }
      (local_58->super_IteratorInput<char,_const_char_*>).best = pcVar8;
    }
  } while (cVar2 != '\0');
  pMVar7 = local_60;
  if (local_8a._10_8_ - local_8a._2_8_ == 0) {
    (local_60->ptr).isSet = false;
  }
  else {
    if (local_8a._10_8_ != local_8a._18_8_) {
      Vector<unsigned_char>::setCapacity
                ((Vector<unsigned_char> *)(local_8a + 2),local_8a._10_8_ - local_8a._2_8_);
    }
    uVar4 = local_8a._2_8_;
    sVar9 = local_8a._10_8_ - local_8a._2_8_;
    local_8a._2_8_ = (uchar *)0x0;
    local_8a._10_8_ = (uchar *)0x0;
    local_8a._18_8_ = (uchar *)0x0;
    (pMVar7->ptr).isSet = true;
    (pMVar7->ptr).field_1.value.ptr = (uchar *)uVar4;
    (pMVar7->ptr).field_1.value.size_ = sVar9;
    (pMVar7->ptr).field_1.value.disposer = (ArrayDisposer *)local_8a._26_8_;
  }
  uVar6 = local_8a._18_8_;
  uVar5 = local_8a._10_8_;
  uVar4 = local_8a._2_8_;
  if ((uchar *)local_8a._2_8_ != (uchar *)0x0) {
    local_8a._2_8_ = 0;
    local_8a._10_8_ = 0;
    local_8a._18_8_ = 0;
    (***(_func_int ***)local_8a._26_8_)(local_8a._26_8_,uVar4,1,uVar5 - uVar4,uVar6 - uVar4,0);
  }
  return pMVar7;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }